

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_snare(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  ROOM_INDEX_DATA *pRVar3;
  undefined4 uVar4;
  char *txt;
  ROOM_AFFECT_DATA local_e0;
  AFFECT_DATA snaretimer;
  
  iVar2 = get_skill(ch,(int)gsn_snare);
  if (iVar2 < 5) {
    txt = "You lay some sticks down in a threatening snare to anyone under an inch tall.\n\r";
    goto LAB_0032ba53;
  }
  bVar1 = is_affected(ch,(int)gsn_snaretimer);
  if (bVar1) {
    txt = "You do not feel ready to lay a new snare yet.\n\r";
    goto LAB_0032ba53;
  }
  bVar1 = is_affected_room(ch->in_room,(int)gsn_snare);
  if (bVar1) {
    txt = "There is already a snare here.\n\r";
    goto LAB_0032ba53;
  }
  pRVar3 = ch->in_room;
  if (((ushort)pRVar3->sector_type < 0xb) &&
     ((0x43cU >> ((ushort)pRVar3->sector_type & 0x1f) & 1) != 0)) {
LAB_0032b939:
    if ((pRVar3->vnum != 0x1644) && (pRVar3->cabal == 0)) {
      init_affect_room(&local_e0);
      local_e0.where = 0;
      local_e0.aftype = 1;
      local_e0.type = gsn_snare;
      local_e0.level = ch->level;
      uVar4._0_2_ = 0x18;
      uVar4._2_2_ = 0;
      local_e0.modifier = 0;
      local_e0.tick_fun = (RAFF_FUN *)0x0;
      local_e0.end_fun = (RAFF_FUN *)0x0;
      local_e0.owner = ch;
      local_e0._24_4_ = uVar4;
      new_affect_to_room(ch->in_room,&local_e0);
      init_affect(&snaretimer);
      snaretimer.where = 0;
      snaretimer.type = gsn_snaretimer;
      snaretimer.level = ch->level;
      snaretimer.modifier = 0;
      snaretimer.aftype = 5;
      snaretimer._32_4_ = uVar4;
      affect_to_char(ch,&snaretimer);
      send_to_char("You lay down vines and plants in a cunningly concealed snare to trap the unwary.\n\r"
                   ,ch);
      act("$n lays down vines and plants in a cunningly concealed snare to trap the unwary.\n\r",ch,
          (void *)0x0,(void *)0x0,0);
      WAIT_STATE(ch,0x30);
      return;
    }
  }
  else {
    bVar1 = is_immortal(ch);
    if (bVar1) {
      pRVar3 = ch->in_room;
      goto LAB_0032b939;
    }
  }
  txt = "You cannot create a snare in this environment.\n\r";
LAB_0032ba53:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_snare(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA af;
	AFFECT_DATA snaretimer;

	if (get_skill(ch, gsn_snare) < 5)
	{
		send_to_char("You lay some sticks down in a threatening snare to anyone under an inch tall.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_snaretimer))
	{
		send_to_char("You do not feel ready to lay a new snare yet.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_snare))
	{
		send_to_char("There is already a snare here.\n\r", ch);
		return;
	}

	if ((ch->in_room->sector_type != SECT_FOREST
			&& ch->in_room->sector_type != SECT_MOUNTAIN
			&& ch->in_room->sector_type != SECT_DESERT
			&& ch->in_room->sector_type != SECT_FIELD
			&& ch->in_room->sector_type != SECT_HILLS
			&& !is_immortal(ch))
		|| (ch->in_room->vnum == 5700 || ch->in_room->cabal))
	{
		send_to_char("You cannot create a snare in this environment.\n\r", ch);
		return;
	}

	init_affect_room(&af);
	af.where = TO_ROOM_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_snare;
	af.level = ch->level;
	af.duration = 24;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.owner = ch;
	af.end_fun = nullptr;
	af.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &af);

	init_affect(&snaretimer);
	snaretimer.where = TO_AFFECTS;
	snaretimer.type = gsn_snaretimer;
	snaretimer.level = ch->level;
	snaretimer.duration = 24;
	snaretimer.location = APPLY_NONE;
	snaretimer.modifier = 0;
	snaretimer.aftype = AFT_INVIS;
	affect_to_char(ch, &snaretimer);

	send_to_char("You lay down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch);
	act("$n lays down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch, 0, 0, TO_ROOM);

	WAIT_STATE(ch, PULSE_VIOLENCE * 4);
}